

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

CTcMakeModule * __thiscall
CTcMake::add_module(CTcMake *this,char *src_name,char *sym_name,char *obj_name,int first)

{
  CTcMakeModule *pCVar1;
  long in_RCX;
  long in_RDX;
  CTcMakeModule *in_RSI;
  CTcMake *in_RDI;
  int in_R8D;
  CTcMakeModule *mod;
  textchar_t *in_stack_00000fb8;
  CTcMakeModule *in_stack_00000fc0;
  CTcMakeModule *in_stack_ffffffffffffffa8;
  
  pCVar1 = (CTcMakeModule *)operator_new(0x68);
  CTcMakeModule::CTcMakeModule(in_RSI);
  CTcMakeModule::set_module_name(in_stack_00000fc0,in_stack_00000fb8);
  if (in_RDX != 0) {
    CTcMakeModule::set_symbol_name((CTcMakeModule *)in_RDI,(textchar_t *)in_stack_ffffffffffffffa8);
  }
  if (in_RCX != 0) {
    CTcMakeModule::set_object_name((CTcMakeModule *)in_RDI,(textchar_t *)in_stack_ffffffffffffffa8);
  }
  if (in_R8D == 0) {
    add_module(in_RDI,in_stack_ffffffffffffffa8);
  }
  else {
    add_module_first(in_RDI,in_stack_ffffffffffffffa8);
  }
  return pCVar1;
}

Assistant:

CTcMakeModule *CTcMake::add_module(const char *src_name,
                                   const char *sym_name,
                                   const char *obj_name,
                                   int first)
{
    /* create a module object */
    CTcMakeModule *mod = new CTcMakeModule();

    /* set the module name */
    mod->set_module_name(src_name);

    /* set the symbol file name if specified */
    if (sym_name != 0)
        mod->set_symbol_name(sym_name);

    /* set the object file name if specified */
    if (obj_name != 0)
        mod->set_object_name(obj_name);

    /* add it to the module list */
    if (first)
        add_module_first(mod);
    else
        add_module(mod);

    /* return the new module */
    return mod;
}